

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::AddMakefile(cmGlobalGenerator *this,cmMakefile *mf)

{
  cmState *this_00;
  pointer ppcVar1;
  cmake *pcVar2;
  pointer ppcVar3;
  int iVar4;
  string *psVar5;
  float fVar6;
  float fVar7;
  allocator<char> local_49;
  string local_48;
  cmMakefile *local_28;
  
  local_28 = mf;
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::push_back(&this->Makefiles,&local_28);
  IndexMakefile(this,local_28);
  this_00 = this->CMakeInstance->State;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CMAKE_NUMBER_OF_MAKEFILES",&local_49);
  psVar5 = cmState::GetInitializedCacheValue(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (psVar5 == (string *)0x0) {
    fVar7 = (1.0 - this->FirstTimeProgress) / 30.0 + this->FirstTimeProgress;
    fVar6 = 0.95;
    if (fVar7 <= 0.95) {
      fVar6 = fVar7;
    }
    this->FirstTimeProgress = fVar6;
    pcVar2 = this->CMakeInstance;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Configuring",&local_49);
    cmake::UpdateProgress(pcVar2,&local_48,this->FirstTimeProgress);
  }
  else {
    iVar4 = atoi((psVar5->_M_dataplus)._M_p);
    ppcVar1 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pcVar2 = this->CMakeInstance;
    ppcVar3 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Configuring",&local_49);
    fVar7 = ((float)(ulong)((long)ppcVar1 - (long)ppcVar3 >> 3) * 0.9) / (float)iVar4;
    fVar6 = 0.9;
    if (fVar7 <= 0.9) {
      fVar6 = fVar7;
    }
    cmake::UpdateProgress(pcVar2,&local_48,fVar6);
  }
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void cmGlobalGenerator::AddMakefile(cmMakefile* mf)
{
  this->Makefiles.push_back(mf);
  this->IndexMakefile(mf);

  // update progress
  // estimate how many lg there will be
  const std::string* numGenC =
    this->CMakeInstance->GetState()->GetInitializedCacheValue(
      "CMAKE_NUMBER_OF_MAKEFILES");

  if (!numGenC) {
    // If CMAKE_NUMBER_OF_MAKEFILES is not set
    // we are in the first time progress and we have no
    // idea how long it will be.  So, just move half way
    // there each time, and don't go over 95%
    this->FirstTimeProgress += ((1.0f - this->FirstTimeProgress) / 30.0f);
    if (this->FirstTimeProgress > 0.95f) {
      this->FirstTimeProgress = 0.95f;
    }
    this->CMakeInstance->UpdateProgress("Configuring",
                                        this->FirstTimeProgress);
    return;
  }

  int numGen = atoi(numGenC->c_str());
  float prog = 0.9f * static_cast<float>(this->Makefiles.size()) /
    static_cast<float>(numGen);
  if (prog > 0.9f) {
    prog = 0.9f;
  }
  this->CMakeInstance->UpdateProgress("Configuring", prog);
}